

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonschema::
properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
update_patch(properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
            json_pointer *instance_location,
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *default_value)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_70;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_30;
  
  local_70.common_ = (common_storage)0x4;
  local_30._0_8_ = 2;
  local_30.float64_.val_ = (double)((long)"infinite loop" + 0xb);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<char_const(&)[4]>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)local_60,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             (string_view_type *)&local_30.common_,(char (*) [4])0x846463);
  local_40._M_allocated_capacity = 4;
  local_40._8_8_ =
       (long)
       "Expected index, single or double quoted name, expression, filter, absolute (\'$\') path or relative (\'@\') path"
       + 0x68;
  jsonpointer::basic_json_pointer<char>::to_string_abi_cxx11_
            ((string_type *)local_60,instance_location);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<std::__cxx11::string>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)&local_30.common_,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             (string_view_type *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *)local_60._0_8_ !=
      (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_30._0_8_ = &DAT_00000005;
  local_30.float64_.val_ = (double)((long)"Expected value" + 9);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)local_60,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             (string_view_type *)&local_30.common_,default_value);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::push_back
            (patch,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_70.common_);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_70.common_);
  return;
}

Assistant:

void update_patch(Json& patch, const jsonpointer::json_pointer& instance_location, Json&& default_value) const
        {
            Json j;
            j.try_emplace("op", "add"); 
            j.try_emplace("path", instance_location.string()); 
            j.try_emplace("value", std::forward<Json>(default_value)); 
            patch.push_back(std::move(j));
        }